

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetStep.c
# Opt level: O0

Aig_Obj_t * Saig_ManRetimeNodeBwd(Aig_Man_t *p,Aig_Obj_t *pObjLo)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  Aig_Obj_t *pAVar7;
  Aig_Obj_t *pAVar8;
  Aig_Obj_t *p_00;
  Aig_Obj_t *p_01;
  int fCompl1;
  int fCompl0;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *pObjNew;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pLi1New;
  Aig_Obj_t *pLi0New;
  Aig_Obj_t *pLo1New;
  Aig_Obj_t *pLo0New;
  Aig_Obj_t *pFanin1;
  Aig_Obj_t *pFanin0;
  Aig_Obj_t *pObjLo_local;
  Aig_Man_t *p_local;
  
  iVar1 = Saig_ManRegNum(p);
  if (iVar1 < 1) {
    __assert_fail("Saig_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigRetStep.c"
                  ,0x81,"Aig_Obj_t *Saig_ManRetimeNodeBwd(Aig_Man_t *, Aig_Obj_t *)");
  }
  iVar1 = Aig_ObjCioId(pObjLo);
  if (0 < iVar1) {
    iVar1 = Saig_ObjIsLo(p,pObjLo);
    if (iVar1 != 0) {
      iVar1 = Aig_ObjCioId(pObjLo);
      iVar2 = Saig_ManPiNum(p);
      pAVar7 = Saig_ManLi(p,iVar1 - iVar2);
      pAVar8 = Aig_ObjFanin0(pAVar7);
      iVar1 = Aig_ObjIsNode(pAVar8);
      if (iVar1 == 0) {
        p_local = (Aig_Man_t *)0x0;
      }
      else {
        p_00 = Aig_ObjFanin0(pAVar8);
        p_01 = Aig_ObjFanin1(pAVar8);
        uVar3 = Aig_ObjFaninC0(pAVar8);
        uVar4 = Aig_ObjFaninC0(pAVar7);
        uVar5 = Aig_ObjFaninC1(pAVar8);
        uVar6 = Aig_ObjFaninC0(pAVar7);
        pAVar7 = Aig_NotCond(p_00,uVar3 ^ uVar4);
        pAVar7 = Aig_ObjCreateCo(p,pAVar7);
        iVar1 = Aig_ManCoNum(p);
        (pAVar7->field_0).CioId = iVar1 + -1;
        pAVar7 = Aig_NotCond(p_01,uVar5 ^ uVar6);
        pAVar7 = Aig_ObjCreateCo(p,pAVar7);
        iVar1 = Aig_ManCoNum(p);
        (pAVar7->field_0).CioId = iVar1 + -1;
        pAVar7 = Aig_ObjCreateCi(p);
        iVar1 = Aig_ManCiNum(p);
        (pAVar7->field_0).CioId = iVar1 + -1;
        pAVar8 = Aig_ObjCreateCi(p);
        iVar1 = Aig_ManCiNum(p);
        (pAVar8->field_0).CioId = iVar1 + -1;
        pAVar7 = Aig_NotCond(pAVar7,uVar3 ^ uVar4);
        pAVar8 = Aig_NotCond(pAVar8,uVar5 ^ uVar6);
        p->nRegs = p->nRegs + 2;
        p_local = (Aig_Man_t *)Aig_And(p,pAVar7,pAVar8);
      }
      return (Aig_Obj_t *)p_local;
    }
    __assert_fail("Saig_ObjIsLo(p, pObjLo)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigRetStep.c"
                  ,0x83,"Aig_Obj_t *Saig_ManRetimeNodeBwd(Aig_Man_t *, Aig_Obj_t *)");
  }
  __assert_fail("Aig_ObjCioId(pObjLo) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigRetStep.c"
                ,0x82,"Aig_Obj_t *Saig_ManRetimeNodeBwd(Aig_Man_t *, Aig_Obj_t *)");
}

Assistant:

Aig_Obj_t * Saig_ManRetimeNodeBwd( Aig_Man_t * p, Aig_Obj_t * pObjLo )
{
    Aig_Obj_t * pFanin0, * pFanin1;
    Aig_Obj_t * pLo0New, * pLo1New;
    Aig_Obj_t * pLi0New, * pLi1New;
    Aig_Obj_t * pObj, * pObjNew, * pObjLi;
    int fCompl0, fCompl1;

    assert( Saig_ManRegNum(p) > 0 );
    assert( Aig_ObjCioId(pObjLo) > 0 );
    assert( Saig_ObjIsLo(p, pObjLo) );

    // get the corresponding latch input
    pObjLi = Saig_ManLi( p, Aig_ObjCioId(pObjLo) - Saig_ManPiNum(p) );

    // get the node
    pObj = Aig_ObjFanin0(pObjLi);
    if ( !Aig_ObjIsNode(pObj) )
        return NULL;

    // get the fanins
    pFanin0 = Aig_ObjFanin0(pObj);
    pFanin1 = Aig_ObjFanin1(pObj);

    // get the complemented attributes of the fanins
    fCompl0 = Aig_ObjFaninC0(pObj) ^ Aig_ObjFaninC0(pObjLi);
    fCompl1 = Aig_ObjFaninC1(pObj) ^ Aig_ObjFaninC0(pObjLi);

    // create latch inputs
    pLi0New = Aig_ObjCreateCo( p, Aig_NotCond(pFanin0, fCompl0) );
    pLi0New->CioId = Aig_ManCoNum(p) - 1;
    pLi1New = Aig_ObjCreateCo( p, Aig_NotCond(pFanin1, fCompl1) );
    pLi1New->CioId = Aig_ManCoNum(p) - 1;

    // create latch outputs
    pLo0New = Aig_ObjCreateCi(p);
    pLo0New->CioId = Aig_ManCiNum(p) - 1;
    pLo1New = Aig_ObjCreateCi(p);
    pLo1New->CioId = Aig_ManCiNum(p) - 1;
    pLo0New = Aig_NotCond( pLo0New, fCompl0 );
    pLo1New = Aig_NotCond( pLo1New, fCompl1 );
    p->nRegs += 2;

    // create node
    pObjNew = Aig_And( p, pLo0New, pLo1New );
//    assert( pObjNew->fPhase == 0 );
    return pObjNew;
}